

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseNestedName(State *state)

{
  bool bVar1;
  State *in_RDI;
  State copy;
  State *in_stack_ffffffffffffffb8;
  State *in_stack_ffffffffffffffc0;
  short local_14;
  
  memcpy(&stack0xffffffffffffffc0,in_RDI,0x30);
  bVar1 = ParseOneCharToken(in_RDI,'N');
  if ((bVar1) && (bVar1 = EnterNestedName(in_RDI), bVar1)) {
    bVar1 = ParseCVQualifiers(in_stack_ffffffffffffffc0);
    bVar1 = Optional(bVar1);
    if ((bVar1) &&
       (((bVar1 = ParsePrefix(in_stack_ffffffffffffffb8), bVar1 &&
         (bVar1 = LeaveNestedName(in_RDI,local_14), bVar1)) &&
        (bVar1 = ParseOneCharToken(in_RDI,'E'), bVar1)))) {
      return true;
    }
  }
  memcpy(in_RDI,&stack0xffffffffffffffc0,0x30);
  return false;
}

Assistant:

static bool ParseNestedName(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'N') &&
      EnterNestedName(state) &&
      Optional(ParseCVQualifiers(state)) &&
      ParsePrefix(state) &&
      LeaveNestedName(state, copy.nest_level) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;
  return false;
}